

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

char * ossl_strerror(unsigned_long error,char *buf,size_t size)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  
  *buf = '\0';
  uVar2 = OpenSSL_version(6);
  iVar1 = curl_msnprintf(buf,size,"%s/%s","OpenSSL",uVar2);
  uVar3 = (ulong)iVar1;
  uVar5 = (size - 2) - uVar3;
  if (uVar3 <= size - 2 && uVar5 != 0) {
    pcVar4 = buf + uVar3;
    buf = pcVar4 + 2;
    pcVar4[0] = ':';
    pcVar4[1] = ' ';
    *buf = '\0';
    size = uVar5;
  }
  ERR_error_string_n(error,buf,size);
  if ((*buf == '\0') && ((ulong)(error != 0) * 5 + 8 < size)) {
    pcVar4 = "Unknown error";
    if (error == 0) {
      pcVar4 = "No error";
    }
    strcpy(buf,pcVar4);
  }
  return buf;
}

Assistant:

static char *ossl_strerror(unsigned long error, char *buf, size_t size)
{
  size_t len;
  DEBUGASSERT(size);
  *buf = '\0';

  len = ossl_version(buf, size);
  DEBUGASSERT(len < (size - 2));
  if(len < (size - 2)) {
    buf += len;
    size -= (len + 2);
    *buf++ = ':';
    *buf++ = ' ';
    *buf = '\0';
  }

#if defined(OPENSSL_IS_BORINGSSL) || defined(OPENSSL_IS_AWSLC)
  ERR_error_string_n((uint32_t)error, buf, size);
#else
  ERR_error_string_n(error, buf, size);
#endif

  if(!*buf) {
    const char *msg = error ? "Unknown error" : "No error";
    if(strlen(msg) < size)
      strcpy(buf, msg);
  }

  return buf;
}